

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptelement.cpp
# Opt level: O0

void __thiscall ScriptElement_CopyOperator_Test::TestBody(ScriptElement_CopyOperator_Test *this)

{
  bool bVar1;
  char *pcVar2;
  ScriptOperator *lhs;
  ScriptOperator *rhs;
  char *rhs_00;
  AssertHelper local_2b8;
  Message local_2b0;
  string local_2a8;
  string local_288;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_5;
  Message local_250;
  ByteData local_248;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_230;
  ByteData local_218;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_200;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_4;
  Message local_1d0;
  int64_t local_1c8;
  int64_t local_1c0;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_3;
  Message local_1a0;
  ByteData local_198;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_180;
  ByteData local_168;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_150;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_2;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_1;
  Message local_100;
  ScriptElementType local_f8;
  ScriptElementType local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar;
  undefined1 local_d0 [8];
  ScriptElement copied_elem;
  ScriptElement op_elem;
  ScriptElement_CopyOperator_Test *this_local;
  
  cfd::core::ScriptElement::ScriptElement
            ((ScriptElement *)&copied_elem.value_,
             (ScriptOperator *)cfd::core::ScriptOperator::OP_NOP);
  cfd::core::ScriptElement::ScriptElement
            ((ScriptElement *)local_d0,(ScriptElement *)&copied_elem.value_);
  local_f4 = cfd::core::ScriptElement::GetType((ScriptElement *)&copied_elem.value_);
  local_f8 = cfd::core::ScriptElement::GetType((ScriptElement *)local_d0);
  testing::internal::EqHelper<false>::
  Compare<cfd::core::ScriptElementType,cfd::core::ScriptElementType>
            ((EqHelper<false> *)local_f0,"op_elem.GetType()","copied_elem.GetType()",&local_f4,
             &local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x58,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  lhs = cfd::core::ScriptElement::GetOpCode((ScriptElement *)&copied_elem.value_);
  rhs = cfd::core::ScriptElement::GetOpCode((ScriptElement *)local_d0);
  testing::internal::EqHelper<false>::Compare<cfd::core::ScriptOperator,cfd::core::ScriptOperator>
            ((EqHelper<false> *)local_118,"op_elem.GetOpCode()","copied_elem.GetOpCode()",lhs,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x59,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  cfd::core::ScriptElement::GetBinaryData(&local_168,(ScriptElement *)&copied_elem.value_);
  cfd::core::ByteData::GetBytes(&local_150,&local_168);
  cfd::core::ScriptElement::GetBinaryData(&local_198,(ScriptElement *)local_d0);
  cfd::core::ByteData::GetBytes(&local_180,&local_198);
  testing::internal::EqHelper<false>::
  Compare<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((EqHelper<false> *)local_138,"op_elem.GetBinaryData().GetBytes()",
             "copied_elem.GetBinaryData().GetBytes()",&local_150,&local_180);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_180);
  cfd::core::ByteData::~ByteData(&local_198);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_150);
  cfd::core::ByteData::~ByteData(&local_168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x5b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  local_1c0 = cfd::core::ScriptElement::GetNumber((ScriptElement *)&copied_elem.value_);
  local_1c8 = cfd::core::ScriptElement::GetNumber((ScriptElement *)local_d0);
  testing::internal::EqHelper<false>::Compare<long,long>
            ((EqHelper<false> *)local_1b8,"op_elem.GetNumber()","copied_elem.GetNumber()",&local_1c0
             ,&local_1c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x5c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  cfd::core::ScriptElement::GetData(&local_218,(ScriptElement *)&copied_elem.value_);
  cfd::core::ByteData::GetBytes(&local_200,&local_218);
  cfd::core::ScriptElement::GetData(&local_248,(ScriptElement *)local_d0);
  cfd::core::ByteData::GetBytes(&local_230,&local_248);
  testing::internal::EqHelper<false>::
  Compare<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((EqHelper<false> *)local_1e8,"op_elem.GetData().GetBytes()",
             "copied_elem.GetData().GetBytes()",&local_200,&local_230);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_230);
  cfd::core::ByteData::~ByteData(&local_248);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_200);
  cfd::core::ByteData::~ByteData(&local_218);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_250);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x5d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  cfd::core::ScriptElement::ToString_abi_cxx11_(&local_288,(ScriptElement *)&copied_elem.value_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ScriptElement::ToString_abi_cxx11_(&local_2a8,(ScriptElement *)local_d0);
  rhs_00 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_268,"op_elem.ToString().c_str()","copied_elem.ToString().c_str()",
             pcVar2,rhs_00);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_288);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x5e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  cfd::core::ScriptElement::~ScriptElement((ScriptElement *)local_d0);
  cfd::core::ScriptElement::~ScriptElement((ScriptElement *)&copied_elem.value_);
  return;
}

Assistant:

TEST(ScriptElement, CopyOperator) {
  ScriptElement op_elem = ScriptElement(ScriptOperator::OP_NOP);
  ScriptElement copied_elem = op_elem;

  EXPECT_EQ(op_elem.GetType(), copied_elem.GetType());
  EXPECT_EQ(op_elem.GetOpCode(), copied_elem.GetOpCode());
  EXPECT_EQ(op_elem.GetBinaryData().GetBytes(),
            copied_elem.GetBinaryData().GetBytes());
  EXPECT_EQ(op_elem.GetNumber(), copied_elem.GetNumber());
  EXPECT_EQ(op_elem.GetData().GetBytes(), copied_elem.GetData().GetBytes());
  EXPECT_STREQ(op_elem.ToString().c_str(), copied_elem.ToString().c_str());
}